

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_map.c
# Opt level: O2

int insert(nghttp2_map_bucket *table,uint32_t tablelen,uint32_t tablelenbits,uint32_t hash,
          nghttp2_map_key_type key,void *data)

{
  nghttp2_map_bucket *pnVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar6 = hash >> (-(char)tablelenbits & 0x1fU);
  uVar7 = 0;
  do {
    pnVar1 = table + uVar6;
    pvVar4 = table[uVar6].data;
    if (pvVar4 == (void *)0x0) {
      pnVar1->hash = hash;
      pnVar1->key = key;
      pnVar1->data = data;
      return 0;
    }
    uVar2 = pnVar1->hash;
    iVar3 = pnVar1->key;
    uVar5 = (ulong)(tablelen - 1 & uVar6 - (uVar2 >> (0x20U - (char)tablelenbits & 0x1f)));
    if (uVar5 < uVar7) {
      pnVar1->hash = hash;
      pnVar1->key = key;
      pnVar1->data = data;
      data = pvVar4;
      uVar7 = uVar5;
      key = iVar3;
      hash = uVar2;
    }
    else if (iVar3 == key) {
      return -0x1f5;
    }
    uVar7 = uVar7 + 1;
    uVar6 = uVar6 + 1 & tablelen - 1;
  } while( true );
}

Assistant:

static int insert(nghttp2_map_bucket *table, uint32_t tablelen,
                  uint32_t tablelenbits, uint32_t hash,
                  nghttp2_map_key_type key, void *data) {
  size_t idx = h2idx(hash, tablelenbits);
  size_t d = 0, dd;
  nghttp2_map_bucket *bkt;

  for (;;) {
    bkt = &table[idx];

    if (bkt->data == NULL) {
      map_bucket_set_data(bkt, hash, key, data);
      return 0;
    }

    dd = distance(tablelen, tablelenbits, bkt, idx);
    if (d > dd) {
      map_bucket_swap(bkt, &hash, &key, &data);
      d = dd;
    } else if (bkt->key == key) {
      /* TODO This check is just a waste after first swap or if this
         function is called from map_resize.  That said, there is no
         difference with or without this conditional in performance
         wise. */
      return NGHTTP2_ERR_INVALID_ARGUMENT;
    }

    ++d;
    idx = (idx + 1) & (tablelen - 1);
  }
}